

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

bool __thiscall ghc::filesystem::path::has_root_path(path *this)

{
  bool bVar1;
  
  bVar1 = has_root_name(this);
  if (bVar1) {
    return true;
  }
  bVar1 = has_root_directory(this);
  return bVar1;
}

Assistant:

GHC_INLINE bool path::has_root_path() const
{
    return has_root_name() || has_root_directory();
}